

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text,bool check_utf8)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar2;
  char *s;
  size_t s_length;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  string_view sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  _anonymous_namespace_ *local_c8;
  char *local_c0;
  undefined1 local_b8 [8];
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  iterator local_50;
  size_type local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  byte local_21;
  string *psStack_20;
  bool check_utf8_local;
  string *text_local;
  WastParser *this_local;
  
  local_21 = check_utf8;
  psStack_20 = text;
  text_local = (string *)this;
  bVar1 = PeekMatch(this,Text,0);
  if (bVar1) {
    Consume((Token *)local_b8,this);
    sVar3 = Token::text((Token *)local_b8);
    bVar2 = std::back_inserter<std::__cxx11::string>(psStack_20);
    local_c8 = (_anonymous_namespace_ *)sVar3._M_len;
    local_c0 = sVar3._M_str;
    sVar3._M_str = (char *)bVar2.container;
    sVar3._M_len = (size_t)local_c0;
    (anonymous_namespace)::RemoveEscapes<std::back_insert_iterator<std::__cxx11::string>>
              (local_c8,sVar3,in_RCX);
    if ((local_21 & 1) != 0) {
      s = (char *)std::__cxx11::string::data();
      s_length = std::__cxx11::string::length();
      bVar1 = IsValidUtf8(s,s_length);
      if (!bVar1) {
        Error(this,0x252d5d);
      }
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"a quoted string",
               (allocator<char> *)((long)&token.field_2.literal_.text._M_str + 7));
    local_50 = &local_70;
    local_48 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token.field_2.literal_.text._M_str + 6));
    __l._M_len = local_48;
    __l._M_array = local_50;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_40,__l,(allocator_type *)((long)&token.field_2.literal_.text._M_str + 6));
    this_local._4_4_ = ErrorExpected(this,&local_40,"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&token.field_2.literal_.text._M_str + 6));
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
    do {
      local_100 = local_100 + -1;
      std::__cxx11::string::~string((string *)local_100);
    } while (local_100 != &local_70);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text._M_str + 7));
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text, bool check_utf8) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (check_utf8 && !IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}